

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tzx.cpp
# Opt level: O1

void TZX_AppendPauseBlock(path *fname,uint16_t pauseAfterMs)

{
  pointer pcVar1;
  FILE *__stream;
  long *local_40 [2];
  long local_30 [2];
  
  __stream = (FILE *)SJ_fopen(fname,"a+b");
  if (__stream == (FILE *)0x0) {
    pcVar1 = (fname->_M_pathname)._M_dataplus._M_p;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,pcVar1,pcVar1 + (fname->_M_pathname)._M_string_length);
    Error("[TZX] Error opening file for append",(char *)local_40[0],FATAL);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  fputc(0x20,__stream);
  fputc((uint)(byte)pauseAfterMs,__stream);
  fputc((uint)(pauseAfterMs >> 8),__stream);
  fclose(__stream);
  return;
}

Assistant:

void TZX_AppendPauseBlock(const std::filesystem::path & fname, uint16_t pauseAfterMs)
{
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "a+b")) {
		Error("[TZX] Error opening file for append", fname.string().c_str(), FATAL);
	}
	fputc(TZXBlockId::Pause, ff); // block id

	fputc(pauseAfterMs & 0xFF, ff);
	fputc(pauseAfterMs >> 8, ff);
	fclose(ff);
}